

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

Function * __thiscall
spvtools::opt::InstrumentPass::GetFunction
          (InstrumentPass *this,Type *return_val,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *args)

{
  IRContext *this_00;
  int iVar1;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Function func;
  Function local_50;
  
  analysis::Function::Function(&local_50,return_val,args);
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  pTVar2 = analysis::TypeManager::GetRegisteredType
                     ((this_00->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,&local_50.super_Type);
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x21])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*pTVar2->_vptr_Type[0x21])(pTVar2);
      local_50.super_Type._vptr_Type = (_func_int **)&PTR__Function_003db2b8;
      if (local_50.param_types_.
          super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.param_types_.
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.param_types_.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.param_types_.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_50.super_Type._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_50.super_Type.decorations_);
      return (Function *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  __assert_fail("type && type->AsFunction()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                ,0x1a8,
                "analysis::Function *spvtools::opt::InstrumentPass::GetFunction(const analysis::Type *, const std::vector<const analysis::Type *> &)"
               );
}

Assistant:

analysis::Function* InstrumentPass::GetFunction(
    const analysis::Type* return_val,
    const std::vector<const analysis::Type*>& args) {
  analysis::Function func(return_val, args);
  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&func);
  assert(type && type->AsFunction());
  return type->AsFunction();
}